

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmStringLiteral(LlvmCompilationContext *ctx,ExprStringLiteral *node)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  LLVMValueRef pLVar3;
  uint i;
  ulong uVar4;
  
  uVar1 = node->length;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
  memset((void *)CONCAT44(extraout_var,iVar2),0,(ulong)((uVar1 & 0xfffffffc) + 4));
  for (uVar4 = 0; uVar4 < node->length; uVar4 = uVar4 + 1) {
    *(char *)((long)CONCAT44(extraout_var,iVar2) + uVar4) = node->value[uVar4];
  }
  pLVar3 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmStringLiteral(LlvmCompilationContext &ctx, ExprStringLiteral *node)
{
	unsigned size = node->length + 1;

	// Align to 4
	size = (size + 3) & ~3;

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	for(unsigned i = 0; i < node->length; i++)
		value[i] = node->value[i];

	LLVMValueRef result = LLVMConstStringInContext(ctx.context, value, size, true);

	return CheckType(ctx, node, result);
}